

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint deflateDynamic(ucvector *out,size_t *bp,Hash *hash,uchar *data,size_t datapos,size_t dataend,
                   LodePNGCompressSettings *settings,uint final)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  uint rest;
  uint num;
  size_t k;
  uint j;
  uint dist;
  uint symbol;
  uint HCLEN;
  uint HDIST;
  uint HLIT;
  size_t i;
  size_t numcodes_d;
  size_t numcodes_ll;
  uint BFINAL;
  size_t datasize;
  uivector bitlen_cl;
  uivector bitlen_lld_e;
  uivector bitlen_lld;
  uivector frequencies_cl;
  uivector frequencies_d;
  uivector frequencies_ll;
  HuffmanTree tree_cl;
  HuffmanTree tree_d;
  HuffmanTree tree_ll;
  uivector lz77_encoded;
  uint error;
  size_t dataend_local;
  size_t datapos_local;
  uchar *data_local;
  Hash *hash_local;
  size_t *bp_local;
  ucvector *out_local;
  
  uivector_init((uivector *)&tree_ll.maxbitlen);
  HuffmanTree_init((HuffmanTree *)&tree_d.maxbitlen);
  HuffmanTree_init((HuffmanTree *)&tree_cl.maxbitlen);
  HuffmanTree_init((HuffmanTree *)&frequencies_ll.allocsize);
  uivector_init((uivector *)&frequencies_d.allocsize);
  uivector_init((uivector *)&frequencies_cl.allocsize);
  uivector_init((uivector *)&bitlen_lld.allocsize);
  uivector_init((uivector *)&bitlen_lld_e.allocsize);
  uivector_init((uivector *)&bitlen_cl.allocsize);
  uivector_init((uivector *)&datasize);
  if (settings->use_lz77 == 0) {
    uVar1 = uivector_resize((uivector *)&tree_ll.maxbitlen,dataend - datapos);
    _HDIST = (uint *)datapos;
    if (uVar1 == 0) {
      lz77_encoded.allocsize._4_4_ = 0x53;
      goto LAB_00136ca3;
    }
    for (; _HDIST < dataend; _HDIST = (uint *)((long)_HDIST + 1)) {
      *(uint *)(tree_ll._24_8_ + ((long)_HDIST - datapos) * 4) = (uint)data[(long)_HDIST];
    }
  }
  else {
    lz77_encoded.allocsize._4_4_ =
         encodeLZ77((uivector *)&tree_ll.maxbitlen,hash,data,datapos,dataend,settings->windowsize,
                    settings->minmatch,settings->nicematch,settings->lazymatching);
    if (lz77_encoded.allocsize._4_4_ != 0) goto LAB_00136ca3;
  }
  uVar1 = uivector_resizev((uivector *)&frequencies_d.allocsize,0x11e,0);
  if (uVar1 == 0) {
    lz77_encoded.allocsize._4_4_ = 0x53;
  }
  else {
    uVar1 = uivector_resizev((uivector *)&frequencies_cl.allocsize,0x1e,0);
    if (uVar1 == 0) {
      lz77_encoded.allocsize._4_4_ = 0x53;
    }
    else {
      for (_HDIST = (uint *)0x0; _HDIST != lz77_encoded.data; _HDIST = (uint *)((long)_HDIST + 1)) {
        uVar1 = *(uint *)(tree_ll._24_8_ + (long)_HDIST * 4);
        *(int *)(frequencies_d.allocsize + (ulong)uVar1 * 4) =
             *(int *)(frequencies_d.allocsize + (ulong)uVar1 * 4) + 1;
        if (0x100 < uVar1) {
          uVar4 = (ulong)*(uint *)(tree_ll._24_8_ + 8 + (long)_HDIST * 4);
          *(int *)(frequencies_cl.allocsize + uVar4 * 4) =
               *(int *)(frequencies_cl.allocsize + uVar4 * 4) + 1;
          _HDIST = (uint *)((long)_HDIST + 3);
        }
      }
      *(undefined4 *)(frequencies_d.allocsize + 0x400) = 1;
      lz77_encoded.allocsize._4_4_ =
           HuffmanTree_makeFromFrequencies
                     ((HuffmanTree *)&tree_d.maxbitlen,(uint *)frequencies_d.allocsize,0x101,
                      (size_t)frequencies_ll.data,0xf);
      if ((lz77_encoded.allocsize._4_4_ == 0) &&
         (lz77_encoded.allocsize._4_4_ =
               HuffmanTree_makeFromFrequencies
                         ((HuffmanTree *)&tree_cl.maxbitlen,(uint *)frequencies_cl.allocsize,2,
                          (size_t)frequencies_d.data,0xf), lz77_encoded.allocsize._4_4_ == 0)) {
        numcodes_d = (size_t)tree_ll.lengths._4_4_;
        if (0x11e < numcodes_d) {
          numcodes_d = 0x11e;
        }
        i = (size_t)tree_d.lengths._4_4_;
        if (0x1e < i) {
          i = 0x1e;
        }
        for (_HDIST = (uint *)0x0; _HDIST != (uint *)numcodes_d; _HDIST = (uint *)((long)_HDIST + 1)
            ) {
          uVar1 = HuffmanTree_getLength((HuffmanTree *)&tree_d.maxbitlen,(uint)_HDIST);
          uivector_push_back((uivector *)&bitlen_lld_e.allocsize,uVar1);
        }
        for (_HDIST = (uint *)0x0; _HDIST != (uint *)i; _HDIST = (uint *)((long)_HDIST + 1)) {
          uVar1 = HuffmanTree_getLength((HuffmanTree *)&tree_cl.maxbitlen,(uint)_HDIST);
          uivector_push_back((uivector *)&bitlen_lld_e.allocsize,uVar1);
        }
        for (_HDIST = (uint *)0x0; _HDIST != (uint *)((ulong)bitlen_lld.data & 0xffffffff);
            _HDIST = (uint *)((long)_HDIST + 1)) {
          k._0_4_ = 0;
          while( true ) {
            bVar6 = false;
            if ((long)_HDIST + (ulong)(uint)k + 1 < ((ulong)bitlen_lld.data & 0xffffffff)) {
              bVar6 = *(int *)(bitlen_lld_e.allocsize + 4 + ((long)_HDIST + (ulong)(uint)k) * 4) ==
                      *(int *)(bitlen_lld_e.allocsize + (long)_HDIST * 4);
            }
            if (!bVar6) break;
            k._0_4_ = (uint)k + 1;
          }
          if ((*(int *)(bitlen_lld_e.allocsize + (long)_HDIST * 4) == 0) && (1 < (uint)k)) {
            uVar1 = (uint)k + 1;
            if (uVar1 < 0xb) {
              uivector_push_back((uivector *)&bitlen_cl.allocsize,0x11);
              uivector_push_back((uivector *)&bitlen_cl.allocsize,(uint)k - 2);
              k._0_4_ = uVar1;
            }
            else {
              k._0_4_ = uVar1;
              if (0x8a < uVar1) {
                k._0_4_ = 0x8a;
              }
              uivector_push_back((uivector *)&bitlen_cl.allocsize,0x12);
              uivector_push_back((uivector *)&bitlen_cl.allocsize,(uint)k - 0xb);
            }
            _HDIST = (uint *)((ulong)((uint)k - 1) + (long)_HDIST);
          }
          else if ((uint)k < 3) {
            uivector_push_back((uivector *)&bitlen_cl.allocsize,
                               *(uint *)(bitlen_lld_e.allocsize + (long)_HDIST * 4));
          }
          else {
            uVar1 = (uint)k % 6;
            uivector_push_back((uivector *)&bitlen_cl.allocsize,
                               *(uint *)(bitlen_lld_e.allocsize + (long)_HDIST * 4));
            for (_rest = 0; _rest < (uint)k / 6; _rest = _rest + 1) {
              uivector_push_back((uivector *)&bitlen_cl.allocsize,0x10);
              uivector_push_back((uivector *)&bitlen_cl.allocsize,3);
            }
            if (uVar1 < 3) {
              k._0_4_ = (uint)k - uVar1;
            }
            else {
              uivector_push_back((uivector *)&bitlen_cl.allocsize,0x10);
              uivector_push_back((uivector *)&bitlen_cl.allocsize,uVar1 - 3);
            }
            _HDIST = (uint *)((ulong)(uint)k + (long)_HDIST);
          }
        }
        uVar1 = uivector_resizev((uivector *)&bitlen_lld.allocsize,0x13,0);
        if (uVar1 == 0) {
          lz77_encoded.allocsize._4_4_ = 0x53;
        }
        else {
          for (_HDIST = (uint *)0x0; _HDIST != bitlen_lld_e.data;
              _HDIST = (uint *)((long)_HDIST + 1)) {
            uVar4 = (ulong)*(uint *)(bitlen_cl.allocsize + (long)_HDIST * 4);
            *(int *)(bitlen_lld.allocsize + uVar4 * 4) =
                 *(int *)(bitlen_lld.allocsize + uVar4 * 4) + 1;
            if (0xf < *(uint *)(bitlen_cl.allocsize + (long)_HDIST * 4)) {
              _HDIST = (uint *)((long)_HDIST + 1);
            }
          }
          lz77_encoded.allocsize._4_4_ =
               HuffmanTree_makeFromFrequencies
                         ((HuffmanTree *)&frequencies_ll.allocsize,(uint *)bitlen_lld.allocsize,
                          (size_t)frequencies_cl.data,(size_t)frequencies_cl.data,7);
          if (lz77_encoded.allocsize._4_4_ == 0) {
            uVar1 = uivector_resize((uivector *)&datasize,(ulong)tree_cl.lengths._4_4_);
            if (uVar1 == 0) {
              lz77_encoded.allocsize._4_4_ = 0x53;
            }
            else {
              for (_HDIST = (uint *)0x0; _HDIST != (uint *)(ulong)tree_cl.lengths._4_4_;
                  _HDIST = (uint *)((long)_HDIST + 1)) {
                uVar1 = HuffmanTree_getLength
                                  ((HuffmanTree *)&frequencies_ll.allocsize,CLCL_ORDER[(long)_HDIST]
                                  );
                *(uint *)(datasize + (long)_HDIST * 4) = uVar1;
              }
              do {
                if (*(int *)(datasize + ((long)bitlen_cl.data + -1) * 4) != 0 ||
                    bitlen_cl.data < (uint *)0x5) goto LAB_00136854;
                uVar1 = uivector_resize((uivector *)&datasize,(long)bitlen_cl.data - 1);
              } while (uVar1 != 0);
              lz77_encoded.allocsize._4_4_ = 0x53;
LAB_00136854:
              if (lz77_encoded.allocsize._4_4_ == 0) {
                if ((*bp & 7) == 0) {
                  ucvector_push_back(out,'\0');
                }
                bVar3 = (byte)*bp & 7;
                lVar5 = out->size - 1;
                out->data[lVar5] = out->data[lVar5] | (byte)(final << bVar3);
                *bp = *bp + 1;
                if ((*bp & 7) == 0) {
                  ucvector_push_back(out,(uchar)(0 << bVar3));
                }
                lVar5 = out->size - 1;
                out->data[lVar5] = out->data[lVar5] | (byte)(0 << ((byte)*bp & 7));
                *bp = *bp + 1;
                if ((*bp & 7) == 0) {
                  ucvector_push_back(out,'\0');
                }
                lVar5 = out->size - 1;
                out->data[lVar5] = out->data[lVar5] | (byte)(1 << ((byte)*bp & 7));
                *bp = *bp + 1;
                for (dist = (int)bitlen_cl.data - 4;
                    *(int *)(datasize + (ulong)(dist + 3) * 4) == 0 && dist != 0; dist = dist - 1) {
                }
                addBitsToStream(bp,out,(int)numcodes_d - 0x101,5);
                addBitsToStream(bp,out,(int)i - 1,5);
                addBitsToStream(bp,out,dist,4);
                for (_HDIST = (uint *)0x0; _HDIST != (uint *)(ulong)(dist + 4);
                    _HDIST = (uint *)((long)_HDIST + 1)) {
                  addBitsToStream(bp,out,*(uint *)(datasize + (long)_HDIST * 4),3);
                }
                for (_HDIST = (uint *)0x0; _HDIST != bitlen_lld_e.data;
                    _HDIST = (uint *)((long)_HDIST + 1)) {
                  uVar1 = HuffmanTree_getCode((HuffmanTree *)&frequencies_ll.allocsize,
                                              *(uint *)(bitlen_cl.allocsize + (long)_HDIST * 4));
                  uVar2 = HuffmanTree_getLength
                                    ((HuffmanTree *)&frequencies_ll.allocsize,
                                     *(uint *)(bitlen_cl.allocsize + (long)_HDIST * 4));
                  addHuffmanSymbol(bp,out,uVar1,uVar2);
                  if (*(int *)(bitlen_cl.allocsize + (long)_HDIST * 4) == 0x10) {
                    addBitsToStream(bp,out,*(uint *)(bitlen_cl.allocsize + 4 + (long)_HDIST * 4),2);
                    _HDIST = (uint *)((long)_HDIST + 1);
                  }
                  else if (*(int *)(bitlen_cl.allocsize + (long)_HDIST * 4) == 0x11) {
                    addBitsToStream(bp,out,*(uint *)(bitlen_cl.allocsize + 4 + (long)_HDIST * 4),3);
                    _HDIST = (uint *)((long)_HDIST + 1);
                  }
                  else if (*(int *)(bitlen_cl.allocsize + (long)_HDIST * 4) == 0x12) {
                    addBitsToStream(bp,out,*(uint *)(bitlen_cl.allocsize + 4 + (long)_HDIST * 4),7);
                    _HDIST = (uint *)((long)_HDIST + 1);
                  }
                }
                writeLZ77data(bp,out,(uivector *)&tree_ll.maxbitlen,(HuffmanTree *)&tree_d.maxbitlen
                              ,(HuffmanTree *)&tree_cl.maxbitlen);
                uVar1 = HuffmanTree_getLength((HuffmanTree *)&tree_d.maxbitlen,0x100);
                if (uVar1 == 0) {
                  lz77_encoded.allocsize._4_4_ = 0x40;
                }
                else {
                  uVar1 = HuffmanTree_getCode((HuffmanTree *)&tree_d.maxbitlen,0x100);
                  uVar2 = HuffmanTree_getLength((HuffmanTree *)&tree_d.maxbitlen,0x100);
                  addHuffmanSymbol(bp,out,uVar1,uVar2);
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00136ca3:
  uivector_cleanup(&tree_ll.maxbitlen);
  HuffmanTree_cleanup((HuffmanTree *)&tree_d.maxbitlen);
  HuffmanTree_cleanup((HuffmanTree *)&tree_cl.maxbitlen);
  HuffmanTree_cleanup((HuffmanTree *)&frequencies_ll.allocsize);
  uivector_cleanup(&frequencies_d.allocsize);
  uivector_cleanup(&frequencies_cl.allocsize);
  uivector_cleanup(&bitlen_lld.allocsize);
  uivector_cleanup(&bitlen_cl.allocsize);
  uivector_cleanup(&bitlen_lld_e.allocsize);
  uivector_cleanup(&datasize);
  return lz77_encoded.allocsize._4_4_;
}

Assistant:

static unsigned deflateDynamic(ucvector* out, size_t* bp, Hash* hash,
                               const unsigned char* data, size_t datapos, size_t dataend,
                               const LodePNGCompressSettings* settings, unsigned final)
{
  unsigned error = 0;

  /*
  A block is compressed as follows: The PNG data is lz77 encoded, resulting in
  literal bytes and length/distance pairs. This is then huffman compressed with
  two huffman trees. One huffman tree is used for the lit and len values ("ll"),
  another huffman tree is used for the dist values ("d"). These two trees are
  stored using their code lengths, and to compress even more these code lengths
  are also run-length encoded and huffman compressed. This gives a huffman tree
  of code lengths "cl". The code lenghts used to describe this third tree are
  the code length code lengths ("clcl").
  */

  /*The lz77 encoded data, represented with integers since there will also be length and distance codes in it*/
  uivector lz77_encoded;
  HuffmanTree tree_ll; /*tree for lit,len values*/
  HuffmanTree tree_d; /*tree for distance codes*/
  HuffmanTree tree_cl; /*tree for encoding the code lengths representing tree_ll and tree_d*/
  uivector frequencies_ll; /*frequency of lit,len codes*/
  uivector frequencies_d; /*frequency of dist codes*/
  uivector frequencies_cl; /*frequency of code length codes*/
  uivector bitlen_lld; /*lit,len,dist code lenghts (int bits), literally (without repeat codes).*/
  uivector bitlen_lld_e; /*bitlen_lld encoded with repeat codes (this is a rudemtary run length compression)*/
  /*bitlen_cl is the code length code lengths ("clcl"). The bit lengths of codes to represent tree_cl
  (these are written as is in the file, it would be crazy to compress these using yet another huffman
  tree that needs to be represented by yet another set of code lengths)*/
  uivector bitlen_cl;
  size_t datasize = dataend - datapos;

  /*
  Due to the huffman compression of huffman tree representations ("two levels"), there are some anologies:
  bitlen_lld is to tree_cl what data is to tree_ll and tree_d.
  bitlen_lld_e is to bitlen_lld what lz77_encoded is to data.
  bitlen_cl is to bitlen_lld_e what bitlen_lld is to lz77_encoded.
  */

  unsigned BFINAL = final;
  size_t numcodes_ll, numcodes_d, i;
  unsigned HLIT, HDIST, HCLEN;

  uivector_init(&lz77_encoded);
  HuffmanTree_init(&tree_ll);
  HuffmanTree_init(&tree_d);
  HuffmanTree_init(&tree_cl);
  uivector_init(&frequencies_ll);
  uivector_init(&frequencies_d);
  uivector_init(&frequencies_cl);
  uivector_init(&bitlen_lld);
  uivector_init(&bitlen_lld_e);
  uivector_init(&bitlen_cl);

  /*This while loop never loops due to a break at the end, it is here to
  allow breaking out of it to the cleanup phase on error conditions.*/
  while(!error)
  {
    if(settings->use_lz77)
    {
      error = encodeLZ77(&lz77_encoded, hash, data, datapos, dataend, settings->windowsize,
                         settings->minmatch, settings->nicematch, settings->lazymatching);
      if(error) break;
    }
    else
    {
      if(!uivector_resize(&lz77_encoded, datasize)) ERROR_BREAK(83 /*alloc fail*/);
      for(i = datapos; i < dataend; ++i) lz77_encoded.data[i - datapos] = data[i]; /*no LZ77, but still will be Huffman compressed*/
    }

    if(!uivector_resizev(&frequencies_ll, 286, 0)) ERROR_BREAK(83 /*alloc fail*/);
    if(!uivector_resizev(&frequencies_d, 30, 0)) ERROR_BREAK(83 /*alloc fail*/);

    /*Count the frequencies of lit, len and dist codes*/
    for(i = 0; i != lz77_encoded.size; ++i)
    {
      unsigned symbol = lz77_encoded.data[i];
      ++frequencies_ll.data[symbol];
      if(symbol > 256)
      {
        unsigned dist = lz77_encoded.data[i + 2];
        ++frequencies_d.data[dist];
        i += 3;
      }
    }
    frequencies_ll.data[256] = 1; /*there will be exactly 1 end code, at the end of the block*/

    /*Make both huffman trees, one for the lit and len codes, one for the dist codes*/
    error = HuffmanTree_makeFromFrequencies(&tree_ll, frequencies_ll.data, 257, frequencies_ll.size, 15);
    if(error) break;
    /*2, not 1, is chosen for mincodes: some buggy PNG decoders require at least 2 symbols in the dist tree*/
    error = HuffmanTree_makeFromFrequencies(&tree_d, frequencies_d.data, 2, frequencies_d.size, 15);
    if(error) break;

    numcodes_ll = tree_ll.numcodes; if(numcodes_ll > 286) numcodes_ll = 286;
    numcodes_d = tree_d.numcodes; if(numcodes_d > 30) numcodes_d = 30;
    /*store the code lengths of both generated trees in bitlen_lld*/
    for(i = 0; i != numcodes_ll; ++i) uivector_push_back(&bitlen_lld, HuffmanTree_getLength(&tree_ll, (unsigned)i));
    for(i = 0; i != numcodes_d; ++i) uivector_push_back(&bitlen_lld, HuffmanTree_getLength(&tree_d, (unsigned)i));

    /*run-length compress bitlen_ldd into bitlen_lld_e by using repeat codes 16 (copy length 3-6 times),
    17 (3-10 zeroes), 18 (11-138 zeroes)*/
    for(i = 0; i != (unsigned)bitlen_lld.size; ++i)
    {
      unsigned j = 0; /*amount of repititions*/
      while(i + j + 1 < (unsigned)bitlen_lld.size && bitlen_lld.data[i + j + 1] == bitlen_lld.data[i]) ++j;

      if(bitlen_lld.data[i] == 0 && j >= 2) /*repeat code for zeroes*/
      {
        ++j; /*include the first zero*/
        if(j <= 10) /*repeat code 17 supports max 10 zeroes*/
        {
          uivector_push_back(&bitlen_lld_e, 17);
          uivector_push_back(&bitlen_lld_e, j - 3);
        }
        else /*repeat code 18 supports max 138 zeroes*/
        {
          if(j > 138) j = 138;
          uivector_push_back(&bitlen_lld_e, 18);
          uivector_push_back(&bitlen_lld_e, j - 11);
        }
        i += (j - 1);
      }
      else if(j >= 3) /*repeat code for value other than zero*/
      {
        size_t k;
        unsigned num = j / 6, rest = j % 6;
        uivector_push_back(&bitlen_lld_e, bitlen_lld.data[i]);
        for(k = 0; k < num; ++k)
        {
          uivector_push_back(&bitlen_lld_e, 16);
          uivector_push_back(&bitlen_lld_e, 6 - 3);
        }
        if(rest >= 3)
        {
          uivector_push_back(&bitlen_lld_e, 16);
          uivector_push_back(&bitlen_lld_e, rest - 3);
        }
        else j -= rest;
        i += j;
      }
      else /*too short to benefit from repeat code*/
      {
        uivector_push_back(&bitlen_lld_e, bitlen_lld.data[i]);
      }
    }

    /*generate tree_cl, the huffmantree of huffmantrees*/

    if(!uivector_resizev(&frequencies_cl, NUM_CODE_LENGTH_CODES, 0)) ERROR_BREAK(83 /*alloc fail*/);
    for(i = 0; i != bitlen_lld_e.size; ++i)
    {
      ++frequencies_cl.data[bitlen_lld_e.data[i]];
      /*after a repeat code come the bits that specify the number of repetitions,
      those don't need to be in the frequencies_cl calculation*/
      if(bitlen_lld_e.data[i] >= 16) ++i;
    }

    error = HuffmanTree_makeFromFrequencies(&tree_cl, frequencies_cl.data,
                                            frequencies_cl.size, frequencies_cl.size, 7);
    if(error) break;

    if(!uivector_resize(&bitlen_cl, tree_cl.numcodes)) ERROR_BREAK(83 /*alloc fail*/);
    for(i = 0; i != tree_cl.numcodes; ++i)
    {
      /*lenghts of code length tree is in the order as specified by deflate*/
      bitlen_cl.data[i] = HuffmanTree_getLength(&tree_cl, CLCL_ORDER[i]);
    }
    while(bitlen_cl.data[bitlen_cl.size - 1] == 0 && bitlen_cl.size > 4)
    {
      /*remove zeros at the end, but minimum size must be 4*/
      if(!uivector_resize(&bitlen_cl, bitlen_cl.size - 1)) ERROR_BREAK(83 /*alloc fail*/);
    }
    if(error) break;

    /*
    Write everything into the output

    After the BFINAL and BTYPE, the dynamic block consists out of the following:
    - 5 bits HLIT, 5 bits HDIST, 4 bits HCLEN
    - (HCLEN+4)*3 bits code lengths of code length alphabet
    - HLIT + 257 code lenghts of lit/length alphabet (encoded using the code length
      alphabet, + possible repetition codes 16, 17, 18)
    - HDIST + 1 code lengths of distance alphabet (encoded using the code length
      alphabet, + possible repetition codes 16, 17, 18)
    - compressed data
    - 256 (end code)
    */

    /*Write block type*/
    addBitToStream(bp, out, BFINAL);
    addBitToStream(bp, out, 0); /*first bit of BTYPE "dynamic"*/
    addBitToStream(bp, out, 1); /*second bit of BTYPE "dynamic"*/

    /*write the HLIT, HDIST and HCLEN values*/
    HLIT = (unsigned)(numcodes_ll - 257);
    HDIST = (unsigned)(numcodes_d - 1);
    HCLEN = (unsigned)bitlen_cl.size - 4;
    /*trim zeroes for HCLEN. HLIT and HDIST were already trimmed at tree creation*/
    while(!bitlen_cl.data[HCLEN + 4 - 1] && HCLEN > 0) --HCLEN;
    addBitsToStream(bp, out, HLIT, 5);
    addBitsToStream(bp, out, HDIST, 5);
    addBitsToStream(bp, out, HCLEN, 4);

    /*write the code lenghts of the code length alphabet*/
    for(i = 0; i != HCLEN + 4; ++i) addBitsToStream(bp, out, bitlen_cl.data[i], 3);

    /*write the lenghts of the lit/len AND the dist alphabet*/
    for(i = 0; i != bitlen_lld_e.size; ++i)
    {
      addHuffmanSymbol(bp, out, HuffmanTree_getCode(&tree_cl, bitlen_lld_e.data[i]),
                       HuffmanTree_getLength(&tree_cl, bitlen_lld_e.data[i]));
      /*extra bits of repeat codes*/
      if(bitlen_lld_e.data[i] == 16) addBitsToStream(bp, out, bitlen_lld_e.data[++i], 2);
      else if(bitlen_lld_e.data[i] == 17) addBitsToStream(bp, out, bitlen_lld_e.data[++i], 3);
      else if(bitlen_lld_e.data[i] == 18) addBitsToStream(bp, out, bitlen_lld_e.data[++i], 7);
    }

    /*write the compressed data symbols*/
    writeLZ77data(bp, out, &lz77_encoded, &tree_ll, &tree_d);
    /*error: the length of the end code 256 must be larger than 0*/
    if(HuffmanTree_getLength(&tree_ll, 256) == 0) ERROR_BREAK(64);

    /*write the end code*/
    addHuffmanSymbol(bp, out, HuffmanTree_getCode(&tree_ll, 256), HuffmanTree_getLength(&tree_ll, 256));

    break; /*end of error-while*/
  }

  /*cleanup*/
  uivector_cleanup(&lz77_encoded);
  HuffmanTree_cleanup(&tree_ll);
  HuffmanTree_cleanup(&tree_d);
  HuffmanTree_cleanup(&tree_cl);
  uivector_cleanup(&frequencies_ll);
  uivector_cleanup(&frequencies_d);
  uivector_cleanup(&frequencies_cl);
  uivector_cleanup(&bitlen_lld_e);
  uivector_cleanup(&bitlen_lld);
  uivector_cleanup(&bitlen_cl);

  return error;
}